

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits_tests.cpp
# Opt level: O2

VersionBitsTester * __thiscall VersionBitsTester::Reset(VersionBitsTester *this)

{
  _Rb_tree_header *p_Var1;
  ThresholdConditionCache *__x;
  pointer ppCVar2;
  TestNeverActiveConditionChecker *pTVar3;
  uint uVar4;
  long lVar5;
  ThresholdConditionCache *this_00;
  long in_FS_OFFSET;
  bool bVar6;
  TestConditionChecker local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->num = (this->num - this->num % 1000) + 1000;
  uVar4 = 0;
  while( true ) {
    ppCVar2 = (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->vpblock).
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3) <= (ulong)uVar4)
    break;
    operator_delete(ppCVar2[uVar4],0x98);
    uVar4 = uVar4 + 1;
  }
  p_Var1 = &local_70.cache._M_t._M_impl.super__Rb_tree_header;
  __x = &local_70.cache;
  pTVar3 = this->checker_never;
  lVar5 = 6;
  while (this_00 = &(pTVar3->super_TestConditionChecker).cache, bVar6 = lVar5 != 0,
        lVar5 = lVar5 + -1, bVar6) {
    local_70.cache._M_t._M_impl._0_8_ = 0;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_70.super_AbstractThresholdConditionChecker._vptr_AbstractThresholdConditionChecker =
         (_func_int **)&PTR_Condition_01140010;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    std::
    _Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
    ::operator=(&this_00[-0x15]._M_t,&__x->_M_t);
    TestConditionChecker::~TestConditionChecker(&local_70);
    local_70.cache._M_t._M_impl._0_8_ = 0;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_70.super_AbstractThresholdConditionChecker._vptr_AbstractThresholdConditionChecker =
         (_func_int **)&PTR_Condition_01140078;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    std::
    _Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
    ::operator=(&this_00[-0xe]._M_t,&__x->_M_t);
    TestConditionChecker::~TestConditionChecker(&local_70);
    local_70.cache._M_t._M_impl._0_8_ = 0;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_70.super_AbstractThresholdConditionChecker._vptr_AbstractThresholdConditionChecker =
         (_func_int **)&PTR_Condition_011400d0;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    std::
    _Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
    ::operator=(&this_00[-7]._M_t,&__x->_M_t);
    TestConditionChecker::~TestConditionChecker(&local_70);
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_70.cache._M_t._M_impl._0_8_ = 0;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_70.super_AbstractThresholdConditionChecker._vptr_AbstractThresholdConditionChecker =
         (_func_int **)&PTR_Condition_01140128;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_70.cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    std::
    _Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
    ::operator=(&this_00->_M_t,&__x->_M_t);
    TestConditionChecker::~TestConditionChecker(&local_70);
    pTVar3 = (TestNeverActiveConditionChecker *)(this_00 + 1);
  }
  ppCVar2 = (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar2) {
    (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppCVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

VersionBitsTester& Reset() {
        // Have each group of tests be counted by the 1000s part, starting at 1000
        num = num - (num % 1000) + 1000;

        for (unsigned int i = 0; i < vpblock.size(); i++) {
            delete vpblock[i];
        }
        for (unsigned int  i = 0; i < CHECKERS; i++) {
            checker[i] = TestConditionChecker();
            checker_delayed[i] = TestDelayedActivationConditionChecker();
            checker_always[i] = TestAlwaysActiveConditionChecker();
            checker_never[i] = TestNeverActiveConditionChecker();
        }
        vpblock.clear();
        return *this;
    }